

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall
FTypeTable::AddType(FTypeTable *this,PType *type,PClass *metatype,intptr_t parm1,intptr_t parm2,
                   size_t bucket)

{
  MetaClass *pMVar1;
  PType *pPVar2;
  size_t local_40;
  size_t bucketcheck;
  size_t bucket_local;
  intptr_t parm2_local;
  intptr_t parm1_local;
  PClass *metatype_local;
  PType *type_local;
  FTypeTable *this_local;
  
  bucketcheck = bucket;
  bucket_local = parm2;
  parm2_local = parm1;
  parm1_local = (intptr_t)metatype;
  metatype_local = (PClass *)type;
  type_local = (PType *)this;
  pMVar1 = PType::GetClass(type);
  if (metatype != pMVar1->TypeTableType) {
    __assert_fail("metatype == type->GetClass()->TypeTableType && \"Metatype does not match passed object\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xd94,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
  }
  pPVar2 = FindType(this,(PClass *)parm1_local,parm2_local,bucket_local,&local_40);
  if (pPVar2 != (PType *)0x0) {
    __assert_fail("FindType(metatype, parm1, parm2, &bucketcheck) == NULL && \"Type must not be inserted more than once\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xd95,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
  }
  if (local_40 != bucketcheck) {
    __assert_fail("bucketcheck == bucket && \"Passed bucket was wrong\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xd96,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
  }
  (metatype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.HashNext =
       this->TypeHash[bucketcheck];
  this->TypeHash[bucketcheck] = (PType *)metatype_local;
  GC::WriteBarrier((DObject *)metatype_local);
  return;
}

Assistant:

void FTypeTable::AddType(PType *type, PClass *metatype, intptr_t parm1, intptr_t parm2, size_t bucket)
{
#ifdef _DEBUG
	size_t bucketcheck;
	assert(metatype == type->GetClass()->TypeTableType && "Metatype does not match passed object");
	assert(FindType(metatype, parm1, parm2, &bucketcheck) == NULL && "Type must not be inserted more than once");
	assert(bucketcheck == bucket && "Passed bucket was wrong");
#endif
	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}